

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O3

TadsListener * TadsListener::launch(char *hostname,ushort portno,TadsListenerThread *thread)

{
  int iVar1;
  OS_CoreSocket *this;
  TadsListener *pTVar2;
  OS_Counter *pOVar3;
  undefined6 in_register_00000032;
  
  this = (OS_CoreSocket *)operator_new(0x40);
  (this->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
  this->s = -1;
  this->err = 0;
  this->wouldblock_sending = 0;
  this->ready_evt = (OS_Event *)0x0;
  this->blocked_evt = (OS_Event *)0x0;
  this->mon_thread = (OS_Socket_Mon_Thread *)0x0;
  (this->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__OS_CoreSocket_0034bb90;
  (this->super_OS_Waitable)._vptr_OS_Waitable = (_func_int **)&PTR__OS_Listener_0034bbb8;
  iVar1 = OS_Listener::open((OS_Listener *)this,hostname,(int)CONCAT62(in_register_00000032,portno))
  ;
  if (iVar1 == 0) {
    pOVar3 = &(this->super_CVmRefCntObj).cnt;
    LOCK();
    (pOVar3->cnt).super___atomic_base<long>._M_i = (pOVar3->cnt).super___atomic_base<long>._M_i + -1
    ;
    UNLOCK();
    if ((pOVar3->cnt).super___atomic_base<long>._M_i == 0) {
      (*(this->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])(this);
    }
  }
  else {
    OS_CoreSocket::set_non_blocking(this);
    thread->port = (OS_Listener *)this;
    iVar1 = OS_Thread::launch(&thread->super_OS_Thread);
    if (iVar1 != 0) {
      pTVar2 = (TadsListener *)operator_new(0x18);
      (pTVar2->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
      (pTVar2->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__TadsListener_0034b960;
      pTVar2->thread = thread;
      LOCK();
      pOVar3 = &(thread->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj.cnt;
      (pOVar3->cnt).super___atomic_base<long>._M_i =
           (pOVar3->cnt).super___atomic_base<long>._M_i + 1;
      UNLOCK();
      return pTVar2;
    }
    CVmWeakRefable::release_ref((CVmWeakRefable *)thread);
  }
  return (TadsListener *)0x0;
}

Assistant:

TadsListener *TadsListener::launch(const char *hostname, ushort portno,
                                   TadsListenerThread *thread)
{
    /* open the network port */
    OS_Listener *l = new OS_Listener();
    if (!l->open(hostname, portno))
    {
        /* couldn't open the port - delete the listener and return failure */
        l->release_ref();
        return 0;
    }

    /* put the port into non-blocking mode */
    l->set_non_blocking();

    /* hand the network port over to the thread - it assumes our reference */
    thread->set_port(l);

    /* launch the listener thread */
    if (!thread->launch())
    {
        /* couldn't launch the thread - delete it and return failure */
        thread->release_ref();
        return 0;
    }

    /* return the new listener object */
    return new TadsListener(thread);
}